

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports-runtime.cpp
# Opt level: O0

void __thiscall
rtosc::helpers::Capture::replyArray(Capture *this,char *param_2,char *args,rtosc_arg_t *vals)

{
  long lVar1;
  long in_RCX;
  undefined8 *puVar2;
  char *in_RDX;
  long in_RDI;
  Capture *unaff_retaddr;
  char *ptr;
  size_t cur_idx;
  char *local_30;
  long local_28;
  
  local_28 = 0;
  for (local_30 = in_RDX; *local_30 != '\0'; local_30 = local_30 + 1) {
    *(char *)(*(long *)(in_RDI + 0x80) + local_28 * 0x18) = *local_30;
    puVar2 = (undefined8 *)(in_RCX + local_28 * 0x10);
    lVar1 = *(long *)(in_RDI + 0x80) + local_28 * 0x18;
    *(undefined8 *)(lVar1 + 8) = *puVar2;
    *(undefined8 *)(lVar1 + 0x10) = puVar2[1];
    local_28 = local_28 + 1;
  }
  *(int *)(in_RDI + 0x88) = (int)local_28;
  map_blobs(unaff_retaddr);
  return;
}

Assistant:

void replyArray(const char*, const char *args,
                    rtosc_arg_t *vals) override
    {
        size_t cur_idx = 0;
        for(const char* ptr = args; *ptr; ++ptr, ++cur_idx)
        {
            assert(cur_idx < max_args);
            arg_vals[cur_idx].type = *ptr;
            arg_vals[cur_idx].val  = vals[cur_idx];
        }
        nargs = cur_idx;
        map_blobs();
    }